

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O1

ChNodeFEAxyzD * __thiscall
chrono::fea::ChNodeFEAxyzD::operator=(ChNodeFEAxyzD *this,ChNodeFEAxyzD *other)

{
  if (other != this) {
    ChNodeFEAxyz::operator=(&this->super_ChNodeFEAxyz,&other->super_ChNodeFEAxyz);
    *(undefined8 *)&(this->super_ChNodeFEAxyz).field_0xf0 =
         *(undefined8 *)&(other->super_ChNodeFEAxyz).field_0xf0;
    *(undefined8 *)&this->field_0xf8 = *(undefined8 *)&other->field_0xf8;
    *(undefined8 *)&this->field_0x100 = *(undefined8 *)&other->field_0x100;
    (this->D_dt).m_data[0] = (other->D_dt).m_data[0];
    (this->D_dt).m_data[1] = (other->D_dt).m_data[1];
    (this->D_dt).m_data[2] = (other->D_dt).m_data[2];
    (this->D_dtdt).m_data[0] = (other->D_dtdt).m_data[0];
    (this->D_dtdt).m_data[1] = (other->D_dtdt).m_data[1];
    (this->D_dtdt).m_data[2] = (other->D_dtdt).m_data[2];
    ChVariablesGenericDiagonalMass::operator=
              (*(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyz).field_0xe8,
               *(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAxyz).field_0xe8);
  }
  return this;
}

Assistant:

ChNodeFEAxyzD& ChNodeFEAxyzD::operator=(const ChNodeFEAxyzD& other) {
    if (&other == this)
        return *this;

    ChNodeFEAxyz::operator=(other);

    D = other.D;
    D_dt = other.D_dt;
    D_dtdt = other.D_dtdt;
    (*variables_D) = (*other.variables_D);
    return *this;
}